

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

saucy_graph *
buildSim2Graph(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randVec,Vec_Int_t **iDep,Vec_Int_t **oDep,
              Vec_Ptr_t **topOrder,Vec_Int_t **obs,Vec_Int_t **ctrl)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  int *pModel;
  int *__ptr;
  int *piVar6;
  Vec_Int_t *pVVar7;
  saucy_graph *psVar8;
  int *piVar9;
  Abc_Ntk_t *pAVar10;
  coloring *pcVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  Abc_Ntk_t *pNtk_00;
  long lVar16;
  long lVar17;
  
  uVar2 = pNtk->vPos->nSize;
  uVar3 = pNtk->vPis->nSize;
  pNtk_00 = (Abc_Ntk_t *)(ulong)uVar3;
  pModel = generateProperInputVector(pNtk_00,(coloring *)(ulong)uVar2,(Vec_Int_t *)c);
  iVar13 = 0;
  if (pModel == (int *)0x0) {
    psVar8 = (saucy_graph *)0x0;
  }
  else {
    lVar16 = (long)(int)uVar2;
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    if (0 < (int)uVar3) {
      pAVar10 = (Abc_Ntk_t *)0x0;
      iVar13 = 0;
      do {
        if (c->clen[c->cfront[(long)pAVar10->nObjCounts + lVar16 + -0x60]] != 0) {
          pModel[(long)pAVar10] = (uint)(pModel[(long)pAVar10] == 0);
          piVar6 = Abc_NtkSimulateOneNode(pNtk,pModel,(int)pAVar10,(Vec_Ptr_t **)oDep);
          pVVar7 = iDep[(long)pAVar10];
          if (pVVar7->nSize < 1) {
            pModel[(long)pAVar10] = (uint)(pModel[(long)pAVar10] == 0);
            if (piVar6 == (int *)0x0) goto LAB_002a7537;
          }
          else {
            lVar17 = 0;
            do {
              iVar4 = pVVar7->pArray[lVar17];
              if (__ptr[iVar4] != piVar6[iVar4]) {
                Vec_IntPush((Vec_Int_t *)topOrder[(long)pAVar10],iVar4);
                if (iDep[(long)pAVar10]->nSize <= lVar17) goto LAB_002a76c9;
                Vec_IntPush(obs[iDep[(long)pAVar10]->pArray[lVar17]],(int)pAVar10);
                iVar13 = iVar13 + 1;
                pVVar7 = iDep[(long)pAVar10];
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < pVVar7->nSize);
            pModel[(long)pAVar10] = (uint)(pModel[(long)pAVar10] == 0);
          }
          free(piVar6);
        }
LAB_002a7537:
        pAVar10 = (Abc_Ntk_t *)((long)&pAVar10->ntkType + 1);
      } while (pAVar10 != pNtk_00);
    }
    psVar8 = (saucy_graph *)malloc(0x18);
    piVar6 = (int *)malloc((long)(int)(uVar3 + uVar2) * 4 + 4);
    piVar9 = (int *)malloc((long)(iVar13 * 2) << 2);
    psVar8->n = uVar3 + uVar2;
    psVar8->e = iVar13;
    psVar8->adj = piVar6;
    psVar8->edg = piVar9;
    *piVar6 = 0;
    if (0 < (int)uVar2) {
      pcVar11 = (coloring *)0x0;
      iVar13 = 0;
      do {
        pVVar7 = obs[(long)pcVar11];
        iVar4 = pVVar7->nSize;
        iVar12 = iVar4 + iVar13;
        piVar6[(long)((long)&pcVar11->lab + 1)] = iVar12;
        if (0 < iVar4) {
          lVar17 = 0;
          do {
            if (pVVar7->nSize <= lVar17) goto LAB_002a76c9;
            piVar9[iVar13 + lVar17] = pVVar7->pArray[lVar17] + uVar2;
            lVar14 = iVar13 + lVar17;
            lVar17 = lVar17 + 1;
          } while (lVar14 + 1 < (long)iVar12);
        }
        pcVar11 = (coloring *)((long)&pcVar11->lab + 1);
        iVar13 = iVar12;
      } while (pcVar11 != (coloring *)(ulong)uVar2);
    }
    if (0 < (int)uVar3) {
      pAVar10 = (Abc_Ntk_t *)0x0;
      do {
        lVar14 = (long)piVar6[(long)pAVar10->nObjCounts + lVar16 + -0x60];
        pVVar5 = topOrder[(long)pAVar10];
        iVar13 = pVVar5->nSize;
        lVar17 = iVar13 + lVar14;
        piVar6[(long)pAVar10->nObjCounts + lVar16 + -0x5f] = (int)lVar17;
        if (0 < (long)iVar13) {
          lVar15 = 0;
          do {
            if (pVVar5->nSize <= lVar15) {
LAB_002a76c9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar9[lVar14 + lVar15] = *(int *)((long)pVVar5->pArray + lVar15 * 4);
            lVar1 = lVar14 + lVar15;
            lVar15 = lVar15 + 1;
          } while (lVar1 + 1 < lVar17);
        }
        pAVar10 = (Abc_Ntk_t *)((long)&pAVar10->ntkType + 1);
      } while (pAVar10 != pNtk_00);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    free(pModel);
    if (0 < (int)uVar3) {
      pAVar10 = (Abc_Ntk_t *)0x0;
      do {
        topOrder[(long)pAVar10]->nSize = 0;
        pAVar10 = (Abc_Ntk_t *)((long)&pAVar10->ntkType + 1);
      } while (pNtk_00 != pAVar10);
    }
    if (0 < (int)uVar2) {
      lVar17 = 0;
      do {
        obs[lVar17]->nSize = 0;
        lVar17 = lVar17 + 1;
      } while (lVar16 != lVar17);
    }
  }
  return psVar8;
}

Assistant:

static struct saucy_graph *
buildSim2Graph( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randVec, Vec_Int_t ** iDep, Vec_Int_t ** oDep, Vec_Ptr_t ** topOrder, Vec_Int_t ** obs,  Vec_Int_t ** ctrl )
{
    int i, j, k;
    struct saucy_graph *g = NULL;
    int n, e = 0, *adj, *edg;
    int * vPiValues;
    int * output, * output2;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);

    extern int * Abc_NtkSimulateOneNode( Abc_Ntk_t * , int * , int , Vec_Ptr_t ** );    
    
    vPiValues = generateProperInputVector(pNtk, c, randVec);
    if (vPiValues == NULL) 
        return NULL;

    output = Abc_NtkVerifySimulatePattern( pNtk, vPiValues );   
    
    for (i = 0; i < numins; i++) {
        if (!c->clen[c->cfront[i+numouts]]) continue;
        if (vPiValues[i] == 0)  vPiValues[i] = 1;
        else                    vPiValues[i] = 0;

        output2 = Abc_NtkSimulateOneNode( pNtk, vPiValues, i, topOrder );

        for (j = 0; j < Vec_IntSize(iDep[i]); j++) {
            if (output[Vec_IntEntry(iDep[i], j)] != output2[Vec_IntEntry(iDep[i], j)]) {
                Vec_IntPush(obs[i], Vec_IntEntry(iDep[i], j));
                Vec_IntPush(ctrl[Vec_IntEntry(iDep[i], j)], i);
                e++;
            }
        }

        if (vPiValues[i] == 0)  vPiValues[i] = 1;
        else                    vPiValues[i] = 0;

        ABC_FREE( output2 );
    }       

    /* build the graph */
    g = ABC_ALLOC(struct saucy_graph, 1);
    n = numouts + numins;
    adj = ints(n+1);
    edg = ints(2*e);        
    g->n = n;
    g->e = e;
    g->adj = adj;
    g->edg = edg;       

    adj[0] = 0;
    for (i = 0; i < numouts; i++) {
        adj[i+1] = adj[i] + Vec_IntSize(ctrl[i]);
        for (k = 0, j = adj[i]; j < adj[i+1]; j++, k++)
            edg[j] = Vec_IntEntry(ctrl[i], k) + numouts;
    }
    for (i = 0; i < numins; i++) {
        adj[i+numouts+1] = adj[i+numouts] + Vec_IntSize(obs[i]);
        for (k = 0, j = adj[i+numouts]; j < adj[i+numouts+1]; j++, k++)
            edg[j] = Vec_IntEntry(obs[i], k);
    }

    /* print graph */
    /*for (i = 0; i < n; i++) {
        printf("%d: ", i);
        for (j = adj[i]; j < adj[i+1]; j++)
            printf("%d ", edg[j]);
        printf("\n");
    }*/

    ABC_FREE( output );
    ABC_FREE( vPiValues );  
    for (j = 0; j < numins; j++)
        Vec_IntClear(obs[j]);
    for (j = 0; j < numouts; j++)
        Vec_IntClear(ctrl[j]);

    return g;
}